

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::SoftmaxWithLoss::SoftmaxWithLoss(SoftmaxWithLoss *this,size_t n)

{
  ulong __n;
  float *pfVar1;
  
  (this->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)&PTR_tag_abi_cxx11__00120be0;
  this->nSize = n;
  (this->softmaxOutput)._M_size = n;
  __n = n * 4;
  pfVar1 = (float *)operator_new(__n);
  (this->softmaxOutput)._M_data = pfVar1;
  memset(pfVar1,0,__n);
  (this->lossGrad)._M_size = n;
  pfVar1 = (float *)operator_new(__n);
  (this->lossGrad)._M_data = pfVar1;
  memset(pfVar1,0,__n);
  return;
}

Assistant:

SoftmaxWithLoss(size_t n) : nSize(n), softmaxOutput(n), lossGrad(n) {}